

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_waitany_(MPIABI_Fint *count,MPIABI_Fint *array_of_requests,int *index,
                    MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *status_local;
  int *index_local;
  MPIABI_Fint *array_of_requests_local;
  MPIABI_Fint *count_local;
  
  mpi_waitany_(count,array_of_requests,index,status,ierror);
  return;
}

Assistant:

void mpiabi_waitany_(
  const MPIABI_Fint * count,
  MPIABI_Fint * array_of_requests,
  int * index,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_waitany_(
    count,
    array_of_requests,
    index,
    status,
    ierror
  );
}